

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  void *pvVar1;
  int *piVar2;
  iterator piVar3;
  iterator piVar4;
  ostream *poVar5;
  int *x;
  iterator __end1;
  iterator __begin1;
  vector<int> *__range1;
  int local_5c;
  undefined1 local_58 [4];
  int i;
  vector<int> v;
  size_t k;
  int b;
  int a;
  int n;
  
  a = 0;
  pvVar1 = (void *)std::istream::operator>>(&std::cin,&b);
  pvVar1 = (void *)std::istream::operator>>(pvVar1,(int *)((long)&k + 4));
  pvVar1 = (void *)std::istream::operator>>(pvVar1,(int *)&k);
  std::istream::operator>>(pvVar1,&v.iCount);
  CP::vector<int>::vector((vector<int> *)local_58,(long)b);
  for (local_5c = 0; local_5c < b; local_5c = local_5c + 1) {
    piVar2 = CP::vector<int>::operator[]((vector<int> *)local_58,local_5c);
    *piVar2 = local_5c;
  }
  piVar3 = CP::vector<int>::begin((vector<int> *)local_58);
  piVar4 = CP::vector<int>::begin((vector<int> *)local_58);
  CP::vector<int>::rotate((vector<int> *)local_58,piVar3 + k._4_4_,piVar4 + (int)k,v.iCount);
  __end1 = CP::vector<int>::begin((vector<int> *)local_58);
  piVar3 = CP::vector<int>::end((vector<int> *)local_58);
  for (; __end1 != piVar3; __end1 = __end1 + 1) {
    poVar5 = (ostream *)std::ostream::operator<<(&std::cout,*__end1);
    std::operator<<(poVar5," ");
  }
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  CP::vector<int>::~vector((vector<int> *)local_58);
  return a;
}

Assistant:

int main() {
  int n,a,b;
  size_t k;
  cin >> n >> a >> b >> k;
  CP::vector<int> v(n);
  for (int i = 0;i < n;i++) v[i] = i;
  v.rotate(v.begin() + a, v.begin() + b,k);
  for (auto &x : v) cout << x << " ";
  cout << endl;
}